

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void joystick_callback(wchar_t joy,wchar_t event)

{
  uint uVar1;
  char *pcVar2;
  double dVar3;
  wchar_t buttonCount;
  wchar_t axisCount;
  uint local_28;
  uint local_24;
  
  uVar1 = counter;
  if (event == L'\x00040001') {
    glfwGetJoystickAxes(joy,(int *)&local_24);
    glfwGetJoystickButtons(joy,(int *)&local_28);
    uVar1 = counter;
    counter = counter + 1;
    dVar3 = glfwGetTime();
    pcVar2 = glfwGetJoystickName(joy);
    printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes and %i buttons\n",dVar3,
           (ulong)uVar1,joy,pcVar2,(ulong)local_24,(ulong)local_28);
    return;
  }
  counter = counter + 1;
  glfwGetTime();
  printf("%08x at %0.3f: Joystick %i was disconnected\n",(ulong)uVar1,joy);
  return;
}

Assistant:

static void joystick_callback(int joy, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axisCount, buttonCount;

        glfwGetJoystickAxes(joy, &axisCount);
        glfwGetJoystickButtons(joy, &buttonCount);

        printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes and %i buttons\n",
               counter++, glfwGetTime(),
               joy,
               glfwGetJoystickName(joy),
               axisCount,
               buttonCount);
    }
    else
    {
        printf("%08x at %0.3f: Joystick %i was disconnected\n",
               counter++, glfwGetTime(), joy);
    }
}